

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase1063::run(TestCase1063 *this)

{
  FiberBase *this_00;
  SourceLocation location;
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t stackSize;
  void *pvVar4;
  int setStackSizeRetval;
  undefined4 uStack_11c;
  Fault f_2;
  WaitScope waitScope;
  pthread_t thread;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1027:3)>
  _kjDefer1027;
  size_t local_b8;
  size_t local_b0;
  pthread_attr_t attr;
  
  stackSize = getSmallStackSize();
  local_b8 = stackSize;
  local_b0 = stackSize;
  bVar1 = isLibcContextHandlingKnownBroken();
  if (!bVar1) {
    EventLoop::EventLoop((EventLoop *)&attr);
    waitScope.busyPollInterval = 0xffffffff;
    waitScope.fiber.ptr = (FiberBase *)0x0;
    waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
    waitScope.loop = (EventLoop *)&attr;
    EventLoop::enterScope((EventLoop *)&attr);
    pvVar4 = operator_new(0x400);
    this_00 = (FiberBase *)((long)pvVar4 + 0x1d8);
    *(undefined ***)((long)pvVar4 + 0x1d8) = &PTR_destroy_0057a0a8;
    *(undefined **)((long)pvVar4 + 0x1e8) = &DAT_0057a0f8;
    location.function = "runWithStackLimit";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location.lineNumber = 0x3f9;
    location.columnNumber = 5;
    kj::_::FiberBase::FiberBase
              (this_00,stackSize,(ExceptionOrValue *)((long)pvVar4 + 0x260),location);
    *(undefined ***)((long)pvVar4 + 0x1d8) = &PTR_destroy_0057a0a8;
    *(undefined **)((long)pvVar4 + 0x1e8) = &DAT_0057a0f8;
    *(size_t **)((long)pvVar4 + 600) = &local_b8;
    *(undefined1 *)((long)pvVar4 + 0x260) = 0;
    *(undefined1 *)((long)pvVar4 + 0x3f8) = 0;
    *(void **)((long)pvVar4 + 0x1e0) = pvVar4;
    _kjDefer1027.maybeFunc.ptr._0_8_ = this_00;
    kj::_::Event::armDepthFirst((Event *)((long)pvVar4 + 0x1e8));
    _kjDefer1027.maybeFunc.ptr.isSet = false;
    _kjDefer1027.maybeFunc.ptr._1_7_ = 0;
    f_2.exception = (Exception *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f_2);
    thread = 0;
    _setStackSizeRetval = (OwnPromiseNode)(OwnPromiseNode)this_00;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&thread);
    Own<kj::_::Fiber<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1018:9)>,_kj::_::PromiseDisposer>
    ::~Own((Own<kj::_::Fiber<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1018:9)>,_kj::_::PromiseDisposer>
            *)&_kjDefer1027);
    Promise<void>::wait((Promise<void> *)&setStackSizeRetval,&waitScope);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&setStackSizeRetval);
    WaitScope::~WaitScope(&waitScope);
    EventLoop::~EventLoop((EventLoop *)&attr);
  }
  uVar2 = pthread_attr_init((pthread_attr_t *)&attr);
  waitScope.loop = (EventLoop *)((ulong)uVar2 << 0x20);
  waitScope._8_8_ = anon_var_dwarf_4fea7;
  waitScope.fiber.ptr = (FiberBase *)&DAT_00000005;
  waitScope.runningStacksPool.ptr._0_1_ = uVar2 == 0;
  if (uVar2 != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
              ((Fault *)&_kjDefer1027,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x402,FAILED,"0 == pthread_attr_init(&attr)","_kjCondition,",
               (DebugComparison<int,_int> *)&waitScope);
    kj::_::Debug::Fault::fatal((Fault *)&_kjDefer1027);
  }
  _kjDefer1027.maybeFunc.ptr.isSet = true;
  _kjDefer1027.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1027:3)>_2
        )&attr;
  iVar3 = pthread_attr_setstacksize((pthread_attr_t *)&attr,stackSize);
  setStackSizeRetval = iVar3;
  if (iVar3 == 0x16) {
    if (kj::_::Debug::minSeverity < 2) {
      waitScope.loop = (EventLoop *)__sysconf(0x4b);
      kj::_::Debug::log<char_const(&)[128],unsigned_long&,long,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x409,WARNING,
                 "\"This platform\'s pthread implementation does not support setting a small stack size. \" \"Skipping pthread-based stack overflow test.\", stackSize, PTHREAD_STACK_MIN, setStackSizeRetval"
                 ,(char (*) [128])
                  "This platform\'s pthread implementation does not support setting a small stack size. Skipping pthread-based stack overflow test."
                 ,&local_b0,(long *)&waitScope,&setStackSizeRetval);
    }
  }
  else {
    waitScope.loop = (EventLoop *)((ulong)waitScope.loop & 0xffffffff00000000);
    waitScope._8_8_ = &setStackSizeRetval;
    waitScope.fiber.ptr = (FiberBase *)anon_var_dwarf_4fea7;
    waitScope.runningStacksPool.ptr = (FiberPool *)&DAT_00000005;
    if (iVar3 != 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int&>&>
                ((Fault *)&thread,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x40b,FAILED,"0 == setStackSizeRetval","_kjCondition,",
                 (DebugComparison<int,_int_&> *)&waitScope);
      kj::_::Debug::Fault::fatal((Fault *)&thread);
    }
    uVar2 = pthread_create(&thread,(pthread_attr_t *)&attr,
                           runWithStackLimit<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1066:32)>
                           ::anon_class_1_0_00000001::__invoke,&local_b8);
    waitScope.loop = (EventLoop *)((ulong)uVar2 << 0x20);
    waitScope._8_8_ = anon_var_dwarf_4fea7;
    waitScope.fiber.ptr = (FiberBase *)&DAT_00000005;
    waitScope.runningStacksPool.ptr._0_1_ = uVar2 == 0;
    if (uVar2 != 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
                (&f_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x414,FAILED,
                 "0 == pthread_create(&thread, &attr, start, reinterpret_cast<void*>(&func))",
                 "_kjCondition,",(DebugComparison<int,_int> *)&waitScope);
      kj::_::Debug::Fault::fatal(&f_2);
    }
    uVar2 = pthread_join(thread,(void **)0x0);
    waitScope.loop = (EventLoop *)((ulong)uVar2 << 0x20);
    waitScope._8_8_ = anon_var_dwarf_4fea7;
    waitScope.fiber.ptr = (FiberBase *)&DAT_00000005;
    waitScope.runningStacksPool.ptr._0_1_ = uVar2 == 0;
    if (uVar2 != 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
                (&f_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x415,FAILED,"0 == pthread_join(thread, nullptr)","_kjCondition,",
                 (DebugComparison<int,_int> *)&waitScope);
      kj::_::Debug::Fault::fatal(&f_2);
    }
  }
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1027:3)>
  ::~Deferred(&_kjDefer1027);
  return;
}

Assistant:

TEST(Async, LargeTaskSetDestructionExceptions) {
  size_t stackSize = getSmallStackSize();

  runWithStackLimit(stackSize, [stackSize]() {
    class ThrowingDestructor: public UnwindDetector {
    public:
      ~ThrowingDestructor() noexcept(false) {
        catchExceptionsIfUnwinding([]() {
          KJ_FAIL_ASSERT("ThrowingDestructor_exception");
        });
      }
    };
    ErrorHandlerImpl errorHandler;
    Maybe<TaskSet> tasks;
    TaskSet& tasksRef = tasks.emplace(errorHandler);

    for (int i = 0; i < stackSize / sizeof(void*); i++) {
      tasksRef.add(kj::Promise<void>(kj::NEVER_DONE).attach(kj::heap<ThrowingDestructor>()));
    }

    KJ_EXPECT_THROW_MESSAGE("ThrowingDestructor_exception", { tasks = kj::none; });
  });
}